

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O0

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::NotLockFreeQueue
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,size_t max_size_)

{
  queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
  *in_RSI;
  long in_RDI;
  
  std::
  queue<std::packaged_task<void()>,std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>>
  ::queue<std::deque<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>>,void>
            (in_RSI);
  *(queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    **)(in_RDI + 0x50) = in_RSI;
  std::mutex::mutex((mutex *)0x10a9d2);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x80));
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0xb0));
  return;
}

Assistant:

NotLockFreeQueue<T>::NotLockFreeQueue(size_t max_size_) : 
        max_size(max_size_) {}